

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QStringList * __thiscall
QDir::entryList(QDir *this,QStringList *nameFilters,Filters filters,SortFlags sort)

{
  bool bVar1;
  bool bVar2;
  compare_eq_result_container<QList<QString>,_QString> cVar3;
  QDirPrivate *pQVar4;
  Int in_ECX;
  undefined8 in_RDX;
  QDirListing *in_RSI;
  QDirPrivate *in_RDI;
  Int in_R8D;
  long in_FS_OFFSET;
  value_type *dirEntry_1;
  QDirListing *__range2_1;
  value_type *dirEntry;
  QDirListing *__range2;
  bool needsSorting;
  QDirPrivate *d;
  QStringList *ret;
  sentinel __end2_1;
  const_iterator __begin2_1;
  sentinel __end2;
  const_iterator __begin2;
  QFileInfoList l;
  QDirListing dirList;
  undefined4 in_stack_fffffffffffffe88;
  SortFlag in_stack_fffffffffffffe8c;
  SortFlag in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  QFileSystemEntry *in_stack_fffffffffffffe98;
  QDirListing *in_stack_fffffffffffffea0;
  QList<QString> *in_stack_fffffffffffffec0;
  QList<QString> *in_stack_fffffffffffffec8;
  QDirPrivate *this_00;
  QDirPrivate *infos;
  QStringList *in_stack_ffffffffffffff50;
  QFileInfoList *in_stack_ffffffffffffff58;
  const_iterator local_90;
  Int local_84;
  undefined1 local_71;
  const_iterator local_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QDirListing local_30;
  QFlagsStorageHelper<QDir::SortFlag,_4> local_28;
  QFlagsStorageHelper<QDir::SortFlag,_4> local_24;
  QFlagsStorageHelper<QDir::Filter,_4> local_20;
  QFlagsStorage<QDir::Filter> sort_00;
  QFlagsStorage<QDir::SortFlag> local_10;
  QFlagsStorage<QDir::Filter> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  infos = in_RDI;
  local_c.i = in_ECX;
  pQVar4 = d_func((QDir *)0x27f522);
  bVar1 = ::operator==((QFlagsStorageHelper<QDir::Filter,_4>)
                       SUB84((ulong)in_stack_fffffffffffffe98 >> 0x20,0),in_stack_fffffffffffffe90);
  if (bVar1) {
    local_c.i = (pQVar4->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
                super_QFlagsStorage<QDir::Filter>.i;
  }
  bVar1 = ::operator==((QFlagsStorageHelper<QDir::SortFlag,_4>)
                       SUB84((ulong)in_stack_fffffffffffffe98 >> 0x20,0),in_stack_fffffffffffffe90);
  local_10.i = in_R8D;
  if (bVar1) {
    local_10.i = (pQVar4->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
                 super_QFlagsStorage<QDir::SortFlag>.i;
  }
  QFlags<QDir::SortFlag>::operator&
            ((QFlags<QDir::SortFlag> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
             ,in_stack_fffffffffffffe8c);
  bVar1 = ::operator!=((QFlagsStorageHelper<QDir::SortFlag,_4>)
                       SUB84((ulong)in_stack_fffffffffffffe98 >> 0x20,0),in_stack_fffffffffffffe90);
  local_20.super_QFlagsStorage<QDir::Filter>.i =
       (QFlagsStorage<QDir::Filter>)
       (pQVar4->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
       super_QFlagsStorage<QDir::Filter>.i;
  sort_00.i = local_c.i;
  bVar2 = ::operator==((QFlags<QDir::Filter>)local_c.i,
                       (QFlags<QDir::Filter>)local_20.super_QFlagsStorage<QDir::Filter>.i);
  if (bVar2) {
    local_24.super_QFlagsStorage<QDir::SortFlag>.i =
         (QFlagsStorage<QDir::SortFlag>)(QFlagsStorage<QDir::SortFlag>)local_10.i;
    local_28.super_QFlagsStorage<QDir::SortFlag>.i =
         (QFlagsStorage<QDir::SortFlag>)
         (pQVar4->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
         super_QFlagsStorage<QDir::SortFlag>.i;
    bVar2 = ::operator==((QFlags<QDir::SortFlag>)local_10.i,
                         (QFlags<QDir::SortFlag>)local_28.super_QFlagsStorage<QDir::SortFlag>.i);
    if (((bVar2) &&
        (cVar3 = QList<QString>::operator==(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0),
        cVar3)) &&
       ((bVar1 || (bVar2 = std::atomic::operator_cast_to_bool
                                     ((atomic<bool> *)in_stack_fffffffffffffe98), bVar2)))) {
      QDirPrivate::initFileLists(this_00,(QDir *)in_RDI);
      QList<QString>::QList
                ((QList<QString> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (QList<QString> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      goto LAB_0027fab4;
    }
  }
  local_30.d = (QDirListingPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::filePath(in_stack_fffffffffffffe98);
  QFlags<QDir::Filter>::toInt((QFlags<QDir::Filter> *)&local_c);
  QDirListing::QDirListing
            (in_RSI,(QString *)this_00,(QStringList *)in_RDI,(uint)((ulong)in_RDX >> 0x20),
             (uint)in_RDX);
  QString::~QString((QString *)0x27f72c);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->nameFilters).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->nameFilters).d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x27f75e);
  if (bVar1) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QFileInfo>::QList((QList<QFileInfo> *)0x27f79f);
    local_70.dirEntry.dirListPtr = (DirEntry)&DAT_aaaaaaaaaaaaaaaa;
    local_70 = QDirListing::begin(in_stack_fffffffffffffea0);
    local_71 = 0xaa;
    QDirListing::end(&local_30);
    while (bVar1 = ::operator!=(&local_70), bVar1) {
      QDirListing::const_iterator::operator*(&local_70);
      QDirListing::DirEntry::fileInfo((DirEntry *)in_stack_fffffffffffffe98);
      QList<QFileInfo>::emplace_back<QFileInfo>
                ((QList<QFileInfo> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (QFileInfo *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QFileInfo::~QFileInfo((QFileInfo *)0x27f879);
      QDirListing::const_iterator::operator++
                ((const_iterator *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    }
    local_84 = local_10.i;
    QDirPrivate::sortFileList
              ((SortFlags)sort_00.i,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               (QFileInfoList *)infos);
    QList<QFileInfo>::~QList((QList<QFileInfo> *)0x27f932);
  }
  else {
    local_90.dirEntry.dirListPtr = (DirEntry)&DAT_aaaaaaaaaaaaaaaa;
    local_90 = QDirListing::begin(in_stack_fffffffffffffea0);
    QDirListing::end(&local_30);
    while (bVar1 = ::operator!=(&local_90), bVar1) {
      QDirListing::const_iterator::operator*(&local_90);
      QDirListing::DirEntry::fileName
                ((DirEntry *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QList<QString>::emplace_back<QString>
                ((QList<QString> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (QString *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QString::~QString((QString *)0x27fa19);
      QDirListing::const_iterator::operator++
                ((const_iterator *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    }
  }
  QDirListing::~QDirListing
            ((QDirListing *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
LAB_0027fab4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QStringList *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QDir::entryList(const QStringList &nameFilters, Filters filters,
                            SortFlags sort) const
{
    Q_D(const QDir);

    if (filters == NoFilter)
        filters = d->filters;
    if (sort == NoSort)
        sort = d->sort;

    const bool needsSorting = (sort & QDir::SortByMask) != QDir::Unsorted;

    if (filters == d->filters && sort == d->sort && nameFilters == d->nameFilters) {
        // Don't fill a QFileInfo cache if we just need names
        if (needsSorting || d->fileCache.fileListsInitialized) {
            d->initFileLists(*this);
            return d->fileCache.files;
        }
    }

    QDirListing dirList(d->dirEntry.filePath(), nameFilters, filters.toInt());
    QStringList ret;
    if (needsSorting) {
        QFileInfoList l;
        for (const auto &dirEntry : dirList)
            l.emplace_back(dirEntry.fileInfo());
        d->sortFileList(sort, l, &ret, nullptr);
    } else {
        for (const auto &dirEntry : dirList)
            ret.emplace_back(dirEntry.fileName());
    }
    return ret;
}